

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_byte_array_stop_decode_char
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uchar *puStack_50;
  char ch;
  char *cp;
  cram_block *b;
  int i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  cp = (char *)0x0;
  if (slice->block_by_id == (cram_block **)0x0) {
    b._4_4_ = 0;
    while ((b._4_4_ < slice->hdr->num_blocks &&
           (((cp = (char *)slice->block[b._4_4_], (cram_block *)cp == (cram_block *)0x0 ||
             (((cram_block *)cp)->content_type != EXTERNAL)) ||
            (((cram_block *)cp)->content_id != (c->field_6).external.type))))) {
      b._4_4_ = b._4_4_ + 1;
    }
    if ((b._4_4_ == slice->hdr->num_blocks) || (cp == (char *)0x0)) {
      return -1;
    }
  }
  else {
    cp = (char *)slice->block_by_id[(c->field_6).beta.nbits];
    if ((cram_block *)cp == (cram_block *)0x0) {
      if (*out_size == 0) {
        return 0;
      }
      return -1;
    }
  }
  if (*(int *)(cp + 0x1c) < *(int *)(cp + 0x14)) {
    out_size_local = (int *)out;
    for (puStack_50 = (uchar *)(*(long *)(cp + 0x20) + (long)*(int *)(cp + 0x1c));
        *puStack_50 != (c->field_6).byte_array_stop.stop; puStack_50 = puStack_50 + 1) {
      if ((long)*(int *)(cp + 0x14) <= (long)puStack_50 - *(long *)(cp + 0x20)) {
        return -1;
      }
      *(uchar *)out_size_local = *puStack_50;
      out_size_local = (int *)((long)out_size_local + 1);
    }
    *out_size = (int)puStack_50 - ((int)*(undefined8 *)(cp + 0x20) + *(int *)(cp + 0x1c));
    *(int *)(cp + 0x1c) = ((int)puStack_50 - (int)*(undefined8 *)(cp + 0x20)) + 1;
    slice_local._4_4_ = 0;
  }
  else {
    slice_local._4_4_ = -1;
  }
  return slice_local._4_4_;
}

Assistant:

static int cram_byte_array_stop_decode_char(cram_slice *slice, cram_codec *c,
					    cram_block *in, char *out,
					    int *out_size) {
    int i;
    cram_block *b = NULL;
    char *cp, ch;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;

    cp = (char *)b->data + b->idx;
    while ((ch = *cp) != (char)c->byte_array_stop.stop) {
	if (cp - (char *)b->data >= b->uncomp_size)
	    return -1;
	*out++ = ch;
	cp++;
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}